

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ppmd7.c
# Opt level: O0

void * AllocUnits(CPpmd7 *p,uint indx)

{
  uint uVar1;
  Byte *pBVar2;
  uint in_ESI;
  CPpmd7 *in_RDI;
  void *retVal;
  UInt32 numBytes;
  CPpmd7 *in_stack_fffffffffffffff8;
  
  if (in_RDI->FreeList[in_ESI] == 0) {
    uVar1 = (uint)in_RDI->Indx2Units[in_ESI] * 0xc;
    if ((uint)((int)in_RDI->HiUnit - (int)in_RDI->LoUnit) < uVar1) {
      pBVar2 = (Byte *)AllocUnitsRare(in_stack_fffffffffffffff8,(uint)((ulong)in_RDI >> 0x20));
    }
    else {
      pBVar2 = in_RDI->LoUnit;
      in_RDI->LoUnit = in_RDI->LoUnit + uVar1;
    }
  }
  else {
    pBVar2 = (Byte *)RemoveNode(in_RDI,in_ESI);
  }
  return pBVar2;
}

Assistant:

static void *AllocUnits(CPpmd7 *p, unsigned indx)
{
  UInt32 numBytes;
  if (p->FreeList[indx] != 0)
    return RemoveNode(p, indx);
  numBytes = U2B(I2U(indx));
  if (numBytes <= (UInt32)(p->HiUnit - p->LoUnit))
  {
    void *retVal = p->LoUnit;
    p->LoUnit += numBytes;
    return retVal;
  }
  return AllocUnitsRare(p, indx);
}